

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDeprecated.cpp
# Opt level: O3

HighsStatus __thiscall Highs::writeHighsInfo(Highs *this,string *filename)

{
  HighsStatus HVar1;
  string local_60;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"writeHighsInfo","");
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"writeInfo","");
  deprecationMessage(this,&local_40,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  HVar1 = writeInfo(this,filename);
  return HVar1;
}

Assistant:

HighsStatus Highs::writeHighsInfo(const std::string& filename) {
  deprecationMessage("writeHighsInfo", "writeInfo");
  return writeInfo(filename);
}